

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  mfb_update_state mVar2;
  uint uVar3;
  mfb_window *window;
  long lVar4;
  uint uVar5;
  Events e;
  _Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)>
  local_138;
  function<void_(mfb_window_*,_mfb_key_mod,_float,_float)> local_120;
  function<void_(mfb_window_*,_int,_int)> local_100;
  function<void_(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)> local_e0;
  function<void_(mfb_window_*,_unsigned_int)> local_c0;
  function<void_(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)> local_a0;
  function<bool_(mfb_window_*)> local_80;
  function<void_(mfb_window_*,_int,_int)> local_60;
  function<void_(mfb_window_*,_bool)> local_40;
  
  window = mfb_open_ex("Input Events CPP Test",800,600,1);
  if (window != (mfb_window *)0x0) {
    local_138._M_f = (offset_in_Events_to_subr)Events::active;
    local_138._8_8_ = 0;
    local_138._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&e;
    std::function<void(mfb_window*,bool)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>))(mfb_window*,bool)>,void>
              ((function<void(mfb_window*,bool)> *)&local_40,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_bool)>
                *)&local_138);
    mfb_set_active_callback(&local_40,window);
    std::_Function_base::~_Function_base(&local_40.super__Function_base);
    local_138._M_f = (offset_in_Events_to_subr)Events::resize;
    local_138._8_8_ = 0;
    local_138._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&e;
    std::function<void(mfb_window*,int,int)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(mfb_window*,int,int)>,void>
              ((function<void(mfb_window*,int,int)> *)&local_60,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>
                *)&local_138);
    mfb_set_resize_callback(&local_60,window);
    std::_Function_base::~_Function_base(&local_60.super__Function_base);
    local_138._M_f = (offset_in_Events_to_subr)Events::close;
    local_138._8_8_ = 0;
    local_138._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&e;
    std::function<bool(mfb_window*)>::
    function<std::_Bind<bool(Events::*(Events*,std::_Placeholder<1>))(mfb_window*)>,void>
              ((function<bool(mfb_window*)> *)&local_80,
               (_Bind<bool_(Events::*(Events_*,_std::_Placeholder<1>))(mfb_window_*)> *)&local_138);
    mfb_set_close_callback(&local_80,window);
    std::_Function_base::~_Function_base(&local_80.super__Function_base);
    local_138._M_f = (offset_in_Events_to_subr)Events::keyboard;
    local_138._8_8_ = 0;
    local_138._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&e;
    std::function<void(mfb_window*,mfb_key,mfb_key_mod,bool)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(mfb_window*,mfb_key,mfb_key_mod,bool)>,void>
              ((function<void(mfb_window*,mfb_key,mfb_key_mod,bool)> *)&local_a0,&local_138);
    mfb_set_keyboard_callback(&local_a0,window);
    std::_Function_base::~_Function_base(&local_a0.super__Function_base);
    local_138._M_f = (offset_in_Events_to_subr)Events::char_input;
    local_138._8_8_ = 0;
    local_138._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&e;
    std::function<void(mfb_window*,unsigned_int)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>))(mfb_window*,unsigned_int)>,void>
              ((function<void(mfb_window*,unsigned_int)> *)&local_c0,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_unsigned_int)>
                *)&local_138);
    mfb_set_char_input_callback(&local_c0,window);
    std::_Function_base::~_Function_base(&local_c0.super__Function_base);
    local_138._M_f = (offset_in_Events_to_subr)Events::mouse_button;
    local_138._8_8_ = 0;
    local_138._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&e;
    std::function<void(mfb_window*,mfb_mouse_button,mfb_key_mod,bool)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(mfb_window*,mfb_mouse_button,mfb_key_mod,bool)>,void>
              ((function<void(mfb_window*,mfb_mouse_button,mfb_key_mod,bool)> *)&local_e0,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)>
                *)&local_138);
    mfb_set_mouse_button_callback(&local_e0,window);
    std::_Function_base::~_Function_base(&local_e0.super__Function_base);
    local_138._M_f = (offset_in_Events_to_subr)Events::mouse_move;
    local_138._8_8_ = 0;
    local_138._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&e;
    std::function<void(mfb_window*,int,int)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(mfb_window*,int,int)>,void>
              ((function<void(mfb_window*,int,int)> *)&local_100,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>
                *)&local_138);
    mfb_set_mouse_move_callback(&local_100,window);
    std::_Function_base::~_Function_base(&local_100.super__Function_base);
    local_138._M_f = (offset_in_Events_to_subr)Events::mouse_scroll;
    local_138._8_8_ = 0;
    local_138._M_bound_args.
    super__Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
    .super__Head_base<0UL,_Events_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
          )(_Tuple_impl<0UL,_Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
            )&e;
    std::function<void(mfb_window*,mfb_key_mod,float,float)>::
    function<std::_Bind<void(Events::*(Events*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(mfb_window*,mfb_key_mod,float,float)>,void>
              ((function<void(mfb_window*,mfb_key_mod,float,float)> *)&local_120,
               (_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key_mod,_float,_float)>
                *)&local_138);
    mfb_set_mouse_scroll_callback(&local_120,window);
    std::_Function_base::~_Function_base(&local_120.super__Function_base);
    mfb_set_user_data(window,"Input Events CPP Test");
    uVar5 = 0xbeef;
    lVar4 = 0;
    do {
      for (; lVar4 != 480000; lVar4 = lVar4 + 1) {
        uVar3 = (int)uVar5 >> 3 ^ uVar5;
        uVar5 = (int)uVar5 >> 1 | (uVar3 & 1) << 0x1e;
        g_buffer[lVar4] = (uVar3 >> 1 & 0xff) * 0x10101 | 0xff000000;
      }
      mVar2 = mfb_update(window,g_buffer);
      if (mVar2 != STATE_OK) {
        return 0;
      }
      _Var1 = mfb_wait_sync(window);
      lVar4 = 0;
    } while (_Var1);
  }
  return 0;
}

Assistant:

int
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window = mfb_open_ex("Input Events CPP Test", WIDTH, HEIGHT, WF_RESIZABLE);
    if (!window)
        return 0;

    Events e;

#if defined(kUseOldFunctions)

    mfb_set_active_callback(window, &e, &Events::active);
    mfb_set_resize_callback(window, &e, &Events::resize);
    mfb_set_close_callback(window, &e, &Events::close);
    mfb_set_keyboard_callback(window, &e, &Events::keyboard);
    mfb_set_char_input_callback(window, &e, &Events::char_input);
    mfb_set_mouse_button_callback(window, &e, &Events::mouse_button);
    mfb_set_mouse_move_callback(window, &e, &Events::mouse_move);
    mfb_set_mouse_scroll_callback(window, &e, &Events::mouse_scroll);

#elif defined(kUseLambdas)

    mfb_set_active_callback([](struct mfb_window *window, bool isActive) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > active: %d (lambda)\n", window_title, isActive);
    }, window);

    mfb_set_resize_callback([](struct mfb_window *window, int width, int height) {
        uint32_t x = 0;
        uint32_t y = 0;
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }

        fprintf(stdout, "%s > resize: %d, %d\n", window_title, width, height);
        if(width > WIDTH) {
            x = (width - WIDTH) >> 1;
            width = WIDTH;
        }
        if(height > HEIGHT) {
            y = (height - HEIGHT) >> 1;
            height = HEIGHT;
        }
        mfb_set_viewport(window, x, y, width, height);
    }, window);

    mfb_set_close_callback([](struct mfb_window *window) {
        const char* window_title = "";
        if (window) {
            window_title = (const char*) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > close\n", window_title);
        return true;    // true => confirm close
                        // false => don't close
    }, window);

    mfb_set_keyboard_callback([](struct mfb_window *window, mfb_key key, mfb_key_mod mod, bool isPressed) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > keyboard: key: %s (pressed: %d) [key_mod: %x]\n", window_title, mfb_get_key_name(key), isPressed, mod);
        if(key == KB_KEY_ESCAPE) {
            mfb_close(window);
        }
    }, window);

    mfb_set_char_input_callback([](struct mfb_window *window, unsigned int charCode) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > charCode: %d\n", window_title, charCode);
    }, window);

    mfb_set_mouse_button_callback([](struct mfb_window *window, mfb_mouse_button button, mfb_key_mod mod, bool isPressed) {
        const char  *window_title = "";
        int         x, y;

        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        x = mfb_get_mouse_x(window);
        y = mfb_get_mouse_y(window);
        fprintf(stdout, "%s > mouse_button: button: %d (pressed: %d) (at: %d, %d) [key_mod: %x]\n", window_title, button, isPressed, x, y, mod);
    }, window);

    mfb_set_mouse_move_callback([](struct mfb_window *window, int x, int y) {
        kUnused(window);
        kUnused(x);
        kUnused(y);
        //const char *window_title = "";
        //if(window) {
        //    window_title = (const char *) mfb_get_user_data(window);
        //}
        //fprintf(stdout, "%s > mouse_move: %d, %d\n", window_title, x, y);
    }, window);

    mfb_set_mouse_scroll_callback([](struct mfb_window *window, mfb_key_mod mod, float deltaX, float deltaY) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > mouse_scroll: x: %f, y: %f [key_mod: %x]\n", window_title, deltaX, deltaY, mod);
    }, window);

#else

    using namespace std::placeholders;

    mfb_set_active_callback      (std::bind(&Events::active,       &e, _1, _2),         window);
    mfb_set_resize_callback      (std::bind(&Events::resize,       &e, _1, _2, _3),     window);
    mfb_set_close_callback       (std::bind(&Events::close,        &e, _1),             window);
    mfb_set_keyboard_callback    (std::bind(&Events::keyboard,     &e, _1, _2, _3, _4), window);
    mfb_set_char_input_callback  (std::bind(&Events::char_input,   &e, _1, _2),         window);
    mfb_set_mouse_button_callback(std::bind(&Events::mouse_button, &e, _1, _2, _3, _4), window);
    mfb_set_mouse_move_callback  (std::bind(&Events::mouse_move,   &e, _1, _2, _3),     window);
    mfb_set_mouse_scroll_callback(std::bind(&Events::mouse_scroll, &e, _1, _2, _3, _4), window);

#endif

    mfb_set_user_data(window, (void *) "Input Events CPP Test");

    do {
        int         i;
        mfb_update_state state;

        for (i = 0; i < WIDTH * HEIGHT; ++i) {
            noise = seed;
            noise >>= 3;
            noise ^= seed;
            carry = noise & 1;
            noise >>= 1;
            seed >>= 1;
            seed |= (carry << 30);
            noise &= 0xFF;
            g_buffer[i] = MFB_ARGB(0xff, noise, noise, noise);
        }

        state = mfb_update(window, g_buffer);
        if (state != STATE_OK) {
            window = 0x0;
            break;
        }
    } while(mfb_wait_sync(window));

    return 0;
}